

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool __thiscall
testing::internal::
MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::MatchAndExplain(MatcherInterfaceAdapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
                 MatchResultListener *listener)

{
  MatcherInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar1;
  pointer pcVar2;
  int iVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pMVar1 = this->impl_;
  pcVar2 = (x->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)local_40,pcVar2,pcVar2 + x->_M_string_length);
  iVar3 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(string *)local_40,listener);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return SUB41(iVar3,0);
}

Assistant:

virtual bool MatchAndExplain(const T& x,
                               MatchResultListener* listener) const {
    return impl_->MatchAndExplain(x, listener);
  }